

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswLcorr.c
# Opt level: O0

void Ssw_ManSweepLatchOne(Ssw_Man_t *p,Aig_Obj_t *pObjRepr,Aig_Obj_t *pObj)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  abctime aVar9;
  abctime clk;
  int RetValue;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjReprFraig;
  Aig_Obj_t *pObjFraig;
  Aig_Obj_t *pObj_local;
  Aig_Obj_t *pObjRepr_local;
  Ssw_Man_t *p_local;
  
  iVar3 = Aig_ObjIsCi(pObj);
  if (iVar3 == 0) {
    __assert_fail("Aig_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswLcorr.c"
                  ,0xa5,"void Ssw_ManSweepLatchOne(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar3 = Aig_ObjIsCi(pObjRepr);
  if ((iVar3 == 0) && (iVar3 = Aig_ObjIsConst1(pObjRepr), iVar3 == 0)) {
    __assert_fail("Aig_ObjIsCi(pObjRepr) || Aig_ObjIsConst1(pObjRepr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswLcorr.c"
                  ,0xa6,"void Ssw_ManSweepLatchOne(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (((p->nCallsCount < 0x65) || (p->nCallsSat <= p->nCallsUnsat)) ||
     (iVar3 = p->nCallsDelta + 1, p->nCallsDelta = iVar3, -1 < iVar3)) {
    p->nCallsDelta = 0;
    aVar5 = Abc_Clock();
    pAVar6 = Saig_ObjLoToLi(p->pAig,pObj);
    pAVar7 = Aig_ObjFanin0(pAVar6);
    Ssw_ManBuildCone_rec(p,pAVar7);
    pAVar6 = Ssw_ObjChild0Fra(p,pAVar6,0);
    iVar3 = Aig_ObjIsCi(pObjRepr);
    if (iVar3 == 0) {
      pObjLi = Ssw_ObjFrame(p,pObjRepr,0);
    }
    else {
      pAVar7 = Saig_ObjLoToLi(p->pAig,pObjRepr);
      pAVar8 = Aig_ObjFanin0(pAVar7);
      Ssw_ManBuildCone_rec(p,pAVar8);
      pObjLi = Ssw_ObjChild0Fra(p,pAVar7,0);
    }
    aVar9 = Abc_Clock();
    p->timeReduce = (aVar9 - aVar5) + p->timeReduce;
    pAVar7 = Aig_Regular(pAVar6);
    pAVar8 = Aig_Regular(pObjLi);
    if (pAVar7 != pAVar8) {
      p->nRecycleCalls = p->nRecycleCalls + 1;
      p->nCallsCount = p->nCallsCount + 1;
      uVar1 = *(ulong *)&pObj->field_0x18;
      uVar2 = *(ulong *)&pObjRepr->field_0x18;
      iVar3 = Aig_ObjPhaseReal(pAVar6);
      iVar4 = Aig_ObjPhaseReal(pObjLi);
      if ((((uint)(uVar1 >> 3) & 1) == ((uint)(uVar2 >> 3) & 1)) == (iVar3 == iVar4)) {
        pAVar7 = Aig_Regular(pObjLi);
        pAVar6 = Aig_Regular(pAVar6);
        iVar3 = Ssw_NodesAreEquiv(p,pAVar7,pAVar6);
        if (iVar3 == 1) {
          p->nCallsUnsat = p->nCallsUnsat + 1;
        }
        else if (iVar3 == -1) {
          Ssw_ClassesRemoveNode(p->ppClasses,pObj);
          p->nCallsUnsat = p->nCallsUnsat + 1;
          p->fRefined = 1;
        }
        else {
          Ssw_SmlAddPattern(p,pObjRepr,pObj);
          p->nPatterns = p->nPatterns + 1;
          p->nCallsSat = p->nCallsSat + 1;
          p->fRefined = 1;
        }
      }
      else {
        p->nPatterns = p->nPatterns + 1;
        p->nStrangers = p->nStrangers + 1;
        p->fRefined = 1;
      }
    }
  }
  return;
}

Assistant:

void Ssw_ManSweepLatchOne( Ssw_Man_t * p, Aig_Obj_t * pObjRepr, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pObjFraig, * pObjReprFraig, * pObjLi;
    int RetValue;
    abctime clk;
    assert( Aig_ObjIsCi(pObj) );
    assert( Aig_ObjIsCi(pObjRepr) || Aig_ObjIsConst1(pObjRepr) );
    // check if it makes sense to skip some calls
    if ( p->nCallsCount > 100 && p->nCallsUnsat < p->nCallsSat )
    {
        if ( ++p->nCallsDelta < 0 )
            return;
    }
    p->nCallsDelta = 0;
clk = Abc_Clock();
    // get the fraiged node
    pObjLi = Saig_ObjLoToLi( p->pAig, pObj );
    Ssw_ManBuildCone_rec( p, Aig_ObjFanin0(pObjLi) );
    pObjFraig = Ssw_ObjChild0Fra( p, pObjLi, 0 );
    // get the fraiged representative
    if ( Aig_ObjIsCi(pObjRepr) )
    {
        pObjLi = Saig_ObjLoToLi( p->pAig, pObjRepr );
        Ssw_ManBuildCone_rec( p, Aig_ObjFanin0(pObjLi) );
        pObjReprFraig = Ssw_ObjChild0Fra( p, pObjLi, 0 );
    }
    else
        pObjReprFraig = Ssw_ObjFrame( p, pObjRepr, 0 );
p->timeReduce += Abc_Clock() - clk;
    // if the fraiged nodes are the same, return
    if ( Aig_Regular(pObjFraig) == Aig_Regular(pObjReprFraig) )
        return;
    p->nRecycleCalls++;
    p->nCallsCount++;

    // check equivalence of the two nodes
    if ( (pObj->fPhase == pObjRepr->fPhase) != (Aig_ObjPhaseReal(pObjFraig) == Aig_ObjPhaseReal(pObjReprFraig)) )
    {
        p->nPatterns++;
        p->nStrangers++;
        p->fRefined = 1;
    }
    else
    {
        RetValue = Ssw_NodesAreEquiv( p, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
        if ( RetValue == 1 )  // proved equivalence
        {
            p->nCallsUnsat++;
            return;
        }
        if ( RetValue == -1 ) // timed out
        {
            Ssw_ClassesRemoveNode( p->ppClasses, pObj );
            p->nCallsUnsat++;
            p->fRefined = 1;
            return;
        }
        else // disproved equivalence
        {
            Ssw_SmlAddPattern( p, pObjRepr, pObj );
            p->nPatterns++;
            p->nCallsSat++;
            p->fRefined = 1;
        }
    }
}